

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

int fmt::v10::detail::parse_nonnegative_int<char>(char **begin,char *end,int error_value)

{
  char *pcVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  char cVar5;
  char *pcVar6;
  char *pcVar7;
  
  pcVar3 = *begin;
  if ((pcVar3 == end) || (cVar5 = *pcVar3, 9 < (byte)(cVar5 - 0x30U))) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/fmt/include/fmt/core.h"
                ,0x87e,"");
    pcVar3 = *begin;
    cVar5 = *pcVar3;
  }
  uVar2 = 0;
  pcVar6 = pcVar3;
  do {
    pcVar1 = pcVar6;
    pcVar6 = pcVar1 + 1;
    uVar4 = (ulong)uVar2;
    uVar2 = ((int)cVar5 + uVar2 * 10) - 0x30;
    pcVar7 = end;
    if (pcVar6 == end) break;
    cVar5 = *pcVar6;
    pcVar7 = pcVar6;
  } while ((byte)(cVar5 - 0x30U) < 10);
  *begin = pcVar7;
  if ((9 < (long)pcVar7 - (long)pcVar3) &&
     (((long)pcVar7 - (long)pcVar3 != 10 ||
      (((ulong)((int)*pcVar1 - 0x30U & 0xfffffffe) + uVar4 * 10 & 0xffffffff80000000) != 0)))) {
    uVar2 = error_value;
  }
  return uVar2;
}

Assistant:

FMT_CONSTEXPR auto parse_nonnegative_int(const Char*& begin, const Char* end,
                                         int error_value) noexcept -> int {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0, prev = 0;
  auto p = begin;
  do {
    prev = value;
    value = value * 10 + unsigned(*p - '0');
    ++p;
  } while (p != end && '0' <= *p && *p <= '9');
  auto num_digits = p - begin;
  begin = p;
  if (num_digits <= std::numeric_limits<int>::digits10)
    return static_cast<int>(value);
  // Check for overflow.
  const unsigned max = to_unsigned((std::numeric_limits<int>::max)());
  return num_digits == std::numeric_limits<int>::digits10 + 1 &&
                 prev * 10ull + unsigned(p[-1] - '0') <= max
             ? static_cast<int>(value)
             : error_value;
}